

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_86fa57::Target::DumpLink(Value *__return_storage_ptr__,Target *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  Value local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  Value local_1a0;
  allocator<char> local_171;
  string local_170;
  char *local_150;
  char *sysroot;
  string local_140;
  Value local_120;
  allocator<char> local_f1;
  string local_f0;
  char *local_d0;
  char *sysrootLink;
  undefined1 local_a0 [8];
  Value commandFragments;
  undefined1 local_40 [8];
  string lang;
  Target *this_local;
  Value *link;
  
  lang.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_40,this->GT,this->Config);
  Json::Value::Value((Value *)&commandFragments.limit_,(string *)local_40);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"language");
  Json::Value::operator=(pVVar3,(Value *)&commandFragments.limit_);
  Json::Value::~Value((Value *)&commandFragments.limit_);
  DumpLinkCommandFragments((Value *)local_a0,this);
  bVar2 = Json::Value::empty((Value *)local_a0);
  if (!bVar2) {
    Json::Value::Value((Value *)&sysrootLink,(Value *)local_a0);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"commandFragments");
    Json::Value::operator=(pVVar3,(Value *)&sysrootLink);
    Json::Value::~Value((Value *)&sysrootLink);
  }
  Json::Value::~Value((Value *)local_a0);
  pcVar1 = this->GT->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CMAKE_SYSROOT_LINK",&local_f1);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    pcVar1 = this->GT->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CMAKE_SYSROOT",&local_171);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    local_150 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar4,&local_1c1);
      DumpSysroot(&local_1a0,this,&local_1c0);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
      Json::Value::operator=(pVVar3,&local_1a0);
      Json::Value::~Value(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,pcVar4,(allocator<char> *)((long)&sysroot + 7));
    DumpSysroot(&local_120,this,&local_140);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
    Json::Value::operator=(pVVar3,&local_120);
    Json::Value::~Value(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysroot + 7));
  }
  bVar2 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)local_40,this->Config);
  if (bVar2) {
    Json::Value::Value(&local_1f0,true);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"lto");
    Json::Value::operator=(pVVar3,&local_1f0);
    Json::Value::~Value(&local_1f0);
  }
  lang.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((lang.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLink()
{
  Json::Value link = Json::objectValue;
  std::string lang = this->GT->GetLinkerLanguage(this->Config);
  link["language"] = lang;
  {
    Json::Value commandFragments = this->DumpLinkCommandFragments();
    if (!commandFragments.empty()) {
      link["commandFragments"] = std::move(commandFragments);
    }
  }
  if (const char* sysrootLink =
        this->GT->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    link["sysroot"] = this->DumpSysroot(sysrootLink);
  } else if (const char* sysroot =
               this->GT->Makefile->GetDefinition("CMAKE_SYSROOT")) {
    link["sysroot"] = this->DumpSysroot(sysroot);
  }
  if (this->GT->IsIPOEnabled(lang, this->Config)) {
    link["lto"] = true;
  }
  return link;
}